

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_1da1d1::Db::parseBracedExpr(Db *this)

{
  char cVar1;
  BracedExpr *pBVar2;
  BracedRangeExpr *pBVar3;
  Node *pNVar4;
  Node *local_60;
  Node *Init_2;
  Node *RangeEnd;
  Node *RangeBegin;
  Node *local_40;
  Node *Init_1;
  Node *Index;
  Node *local_28;
  Node *Init;
  Node *Field;
  Db *this_local;
  
  Field = (Node *)this;
  cVar1 = look(this,0);
  if (cVar1 == 'd') {
    cVar1 = look(this,1);
    if (cVar1 == 'X') {
      this->First = this->First + 2;
      RangeEnd = parseExpr(this);
      if (RangeEnd == (Node *)0x0) {
        return (Node *)0x0;
      }
      Init_2 = parseExpr(this);
      if (Init_2 == (Node *)0x0) {
        return (Node *)0x0;
      }
      local_60 = parseBracedExpr(this);
      if (local_60 == (Node *)0x0) {
        return (Node *)0x0;
      }
      pBVar3 = (anonymous_namespace)::Db::
               make<(anonymous_namespace)::BracedRangeExpr,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                         ((Db *)this,&RangeEnd,&Init_2,&local_60);
      return (Node *)pBVar3;
    }
    if (cVar1 == 'i') {
      this->First = this->First + 2;
      Init = parseSourceName(this,(NameState *)0x0);
      if (Init == (Node *)0x0) {
        return (Node *)0x0;
      }
      local_28 = parseBracedExpr(this);
      if (local_28 == (Node *)0x0) {
        return (Node *)0x0;
      }
      Index._7_1_ = 0;
      pBVar2 = (anonymous_namespace)::Db::
               make<(anonymous_namespace)::BracedExpr,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&,bool>
                         ((Db *)this,&Init,&local_28,(bool *)((long)&Index + 7));
      return (Node *)pBVar2;
    }
    if (cVar1 == 'x') {
      this->First = this->First + 2;
      Init_1 = parseExpr(this);
      if (Init_1 == (Node *)0x0) {
        return (Node *)0x0;
      }
      local_40 = parseBracedExpr(this);
      if (local_40 == (Node *)0x0) {
        return (Node *)0x0;
      }
      RangeBegin._7_1_ = 1;
      pBVar2 = (anonymous_namespace)::Db::
               make<(anonymous_namespace)::BracedExpr,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&,bool>
                         ((Db *)this,&Init_1,&local_40,(bool *)((long)&RangeBegin + 7));
      return (Node *)pBVar2;
    }
  }
  pNVar4 = parseExpr(this);
  return pNVar4;
}

Assistant:

Node *Db::parseBracedExpr() {
  if (look() == 'd') {
    switch (look(1)) {
    case 'i': {
      First += 2;
      Node *Field = parseSourceName(/*NameState=*/nullptr);
      if (Field == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedExpr>(Field, Init, /*isArray=*/false);
    }
    case 'x': {
      First += 2;
      Node *Index = parseExpr();
      if (Index == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedExpr>(Index, Init, /*isArray=*/true);
    }
    case 'X': {
      First += 2;
      Node *RangeBegin = parseExpr();
      if (RangeBegin == nullptr)
        return nullptr;
      Node *RangeEnd = parseExpr();
      if (RangeEnd == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedRangeExpr>(RangeBegin, RangeEnd, Init);
    }
    }
  }
  return parseExpr();
}